

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

InputMap * __thiscall Omega_h::InputMap::get_map(InputMap *this,string *name)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Input *input;
  InputMap *pIVar3;
  shared_ptr<Omega_h::Input> sptr;
  shared_ptr<Omega_h::Input> local_20;
  
  bVar2 = is_input<Omega_h::InputMap>(this,name);
  if (!bVar2) {
    local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x48);
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input)._vptr_Input = (_func_int **)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input).parent = (Input *)0x0;
    *(undefined8 *)
     &(((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_Input).used = 0;
    *(undefined8 *)
     &(((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->map)._M_t._M_impl = 0;
    *(undefined8 *)
     &(((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(((InputMap *)
               local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->map)
              ._M_t._M_impl.super__Rb_tree_header;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input).parent = (Input *)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input).used = false;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input)._vptr_Input = (_func_int **)&PTR__InputMap_004c5848;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (((InputMap *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputMap*>
              (&local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (InputMap *)
               local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    add(this,name,&local_20);
    if (local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  input = find_named_input(this,name);
  input->used = true;
  pIVar3 = as_type<Omega_h::InputMap>(input);
  return pIVar3;
}

Assistant:

InputMap& InputMap::get_map(std::string const& name) {
  if (!is_map(name)) {
    std::shared_ptr<Input> sptr(new InputMap());
    this->add(name, std::move(sptr));
  }
  return this->use_input<InputMap>(name);
}